

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

bool __thiscall Fossilize::VulkanDevice::init_device(VulkanDevice *this,Options *opts)

{
  VkInstance *ppVVar1;
  VkPhysicalDeviceProperties *pVVar2;
  pointer pVVar3;
  VkApplicationInfo *pVVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  bool bVar7;
  bool bVar8;
  VkResult VVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  VkBaseInStructure *sin;
  PFN_vkGetPhysicalDeviceProperties2KHR *pp_Var14;
  VkPhysicalDeviceFeatures2 *pVVar15;
  pointer pVVar16;
  pointer pVVar17;
  long lVar18;
  pointer pVVar19;
  uint uVar20;
  VkPhysicalDeviceProperties2 *__s;
  uint32_t *layer;
  char *pcVar21;
  VkPhysicalDevice pVVar22;
  uint uVar23;
  VkExtensionProperties *ext;
  pointer pVVar24;
  VkPhysicalDeviceFeatures2 *target_features;
  VkPhysicalDeviceFeatures2 *__src;
  _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
  *p_Var25;
  ulong uVar26;
  uint32_t i_2;
  uint32_t i;
  ulong uVar27;
  _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
  *this_00;
  difference_type __trip_count;
  ulong uVar28;
  long lVar29;
  size_t sStack_7f0;
  uint32_t gpu_count;
  uint32_t device_layer_count;
  uint32_t device_ext_count;
  uint32_t ext_count;
  pointer local_7c0;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_extensions;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> gpus;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> exts;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> device_layers;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_layers;
  char *local_6f8;
  uint32_t validation_ext_count;
  uint32_t family_count;
  VkInstanceCreateInfo instance_info;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> device_ext_props;
  undefined8 local_658;
  void *pvStack_650;
  undefined8 local_648;
  vector<const_char_*,_std::allocator<const_char_*>_> active_exts;
  vector<const_char_*,_std::allocator<const_char_*>_> active_layers;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> validation_extensions;
  size_t active_extension_count;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  VkBool32 local_5b0;
  VkBool32 VStack_5ac;
  undefined8 uStack_5a8;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_props;
  VkPhysicalDeviceFeatures2 gpu_features2;
  VkPhysicalDeviceFeatures2 replacement_pdf2;
  VkApplicationInfo app;
  VkPhysicalDeviceProperties2 gpu_props2;
  
  if (opts->null_device == true) {
    init_null_device(this);
    return true;
  }
  VVar9 = volkInitialize();
  if (VVar9 == VK_SUCCESS) {
    uVar10 = volkGetInstanceVersion();
    uVar20 = uVar10 & 0xfffff000;
    if (uVar20 != 0) {
      uVar23 = uVar20;
      if ((opts->application_info != (VkApplicationInfo *)0x0) &&
         (uVar23 = opts->application_info->apiVersion & 0xfffff000, uVar20 < uVar23)) {
        pcVar21 = 
        "Fossilize ERROR: Database is targeting an API version which is unsupported by this Vulkan loader.\n"
        ;
        sStack_7f0 = 0x62;
        goto LAB_00178fb2;
      }
      ext_count = 0;
      VVar9 = (*vkEnumerateInstanceExtensionProperties)
                        ((char *)0x0,&ext_count,(VkExtensionProperties *)0x0);
      if (VVar9 != VK_SUCCESS) {
        return false;
      }
      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                (&exts,(ulong)ext_count,(allocator_type *)&gpu_props2);
      if (ext_count != 0) {
        bVar7 = false;
        VVar9 = (*vkEnumerateInstanceExtensionProperties)
                          ((char *)0x0,&ext_count,
                           exts.
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (VVar9 != VK_SUCCESS) goto LAB_00178f6b;
      }
      active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (opts->enable_validation == true) {
        replacement_pdf2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        VVar9 = (*vkEnumerateInstanceLayerProperties)
                          (&replacement_pdf2.sType,(VkLayerProperties *)0x0);
        if (VVar9 == VK_SUCCESS) {
          std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                    ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)&gpu_props2,
                     (ulong)replacement_pdf2.sType,(allocator_type *)&gpu_features2);
          pcVar21 = (char *)gpu_props2._0_8_;
          VVar9 = (*vkEnumerateInstanceLayerProperties)
                            (&replacement_pdf2.sType,(VkLayerProperties *)gpu_props2._0_8_);
          if (VVar9 == VK_SUCCESS) {
            bVar7 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                               &gpu_props2,pcVar21);
            if (bVar7) {
              gpu_features2._0_8_ = anon_var_dwarf_1ec80f;
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&active_layers,
                         (char **)&gpu_features2);
              std::_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>::
              ~_Vector_base((_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                            &gpu_props2);
              goto LAB_00178cae;
            }
            fwrite("Fossilize ERROR: Cannot find VK_LAYER_KHRONOS_validation layer.\n",0x40,1,
                   _stderr);
            fflush(_stderr);
          }
          std::_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>::~_Vector_base
                    ((_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                     &gpu_props2);
        }
        bVar7 = false;
      }
      else {
LAB_00178cae:
        ppcVar6 = active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        ppcVar5 = active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar7 = find_extension(&exts,"VK_EXT_debug_report");
        local_7c0 = (pointer)CONCAT71(local_7c0._1_7_,bVar7);
        instance_info.pNext = (void *)0x0;
        instance_info.enabledExtensionCount = 0;
        instance_info._52_4_ = 0;
        instance_info.ppEnabledExtensionNames = (char **)0x0;
        instance_info.flags = 0;
        instance_info._20_4_ = 0;
        instance_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
        instance_info._4_4_ = 0;
        app.applicationVersion = 0;
        app._28_4_ = 0;
        app.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        app._4_4_ = 0;
        app.pNext = (void *)0x0;
        app._40_8_ = ((ulong)uVar10 & 0xfffff000) << 0x20;
        app.pApplicationName = "Fossilize Replayer";
        uVar28 = (long)ppcVar6 - (long)ppcVar5;
        instance_info.ppEnabledLayerNames = ppcVar5;
        if (uVar28 == 0) {
          instance_info.ppEnabledLayerNames = (char **)0x0;
        }
        app.pEngineName = "Fossilize";
        uVar28 = uVar28 >> 3;
        instance_info._32_8_ = uVar28 & 0xffffffff;
        instance_info.pApplicationInfo = opts->application_info;
        if (opts->application_info == (VkApplicationInfo *)0x0) {
          instance_info.pApplicationInfo = &app;
        }
        for (uVar27 = 0; uVar27 < (uVar28 & 0xffffffff); uVar27 = uVar27 + 1) {
          fprintf(_stderr,"Fossilize INFO: Enabling instance layer: %s\n",
                  instance_info.ppEnabledLayerNames[uVar27]);
          fflush(_stderr);
          uVar28 = instance_info._32_8_ & 0xffffffff;
        }
        for (uVar28 = 0; uVar28 < (instance_info._48_8_ & 0xffffffff); uVar28 = uVar28 + 1) {
          fprintf(_stderr,"Fossilize INFO: Enabling instance extension: %s\n",
                  instance_info.ppEnabledExtensionNames[uVar28]);
          fflush(_stderr);
        }
        active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (pVVar24 = exts.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pVVar24 !=
            exts.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_finish; pVVar24 = pVVar24 + 1) {
          if ((0x400fff < (instance_info.pApplicationInfo)->apiVersion) ||
             (iVar11 = strcmp("VK_KHR_surface_protected_capabilities",pVVar24->extensionName),
             iVar11 != 0)) {
            gpu_props2._0_8_ = pVVar24;
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&active_exts,
                       (char **)&gpu_props2);
          }
        }
        instance_info.ppEnabledExtensionNames =
             active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((long)active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0) {
          instance_info.ppEnabledExtensionNames = (char **)0x0;
        }
        instance_info.enabledExtensionCount =
             (uint32_t)
             ((ulong)((long)active_exts.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)active_exts.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
        ppVVar1 = &this->instance;
        VVar9 = (*vkCreateInstance)(&instance_info,(VkAllocationCallbacks *)0x0,ppVVar1);
        if (VVar9 == VK_SUCCESS) {
          volkLoadInstance(*ppVVar1);
          if ((char)local_7c0 != '\0') {
            gpu_props2.pNext = (void *)0x0;
            gpu_props2.sType = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
            gpu_props2._4_4_ = 0;
            gpu_props2.properties._8_8_ = debug_callback;
            gpu_props2.properties.apiVersion = 8;
            gpu_props2.properties.driverVersion = 0;
            bVar7 = false;
            gpu_props2.properties._16_8_ = this;
            VVar9 = (*vkCreateDebugReportCallbackEXT)
                              (this->instance,(VkDebugReportCallbackCreateInfoEXT *)&gpu_props2,
                               (VkAllocationCallbacks *)0x0,&this->callback);
            if (VVar9 != VK_SUCCESS) goto LAB_00178f51;
          }
          gpu_count = 0;
          bVar7 = false;
          VVar9 = (*vkEnumeratePhysicalDevices)(*ppVVar1,&gpu_count,(VkPhysicalDevice *)0x0);
          if (VVar9 == VK_SUCCESS) {
            std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
                      (&gpus,(ulong)gpu_count,(allocator_type *)&gpu_props2);
            if (gpu_count == 0) {
              fwrite("Fossilize ERROR: No physical devices.\n",0x26,1,_stderr);
LAB_0017907f:
              fflush(_stderr);
LAB_00178f44:
              bVar7 = false;
            }
            else {
              VVar9 = (*vkEnumeratePhysicalDevices)
                                (*ppVVar1,&gpu_count,
                                 gpus.
                                 super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              if (VVar9 != VK_SUCCESS) goto LAB_00178f44;
              pVVar2 = &this->gpu_props;
              pcVar21 = (this->gpu_props).deviceName;
              for (uVar28 = 0; uVar28 < gpu_count; uVar28 = uVar28 + 1) {
                (*vkGetPhysicalDeviceProperties)
                          (gpus.
                           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28],pVVar2);
                fprintf(_stderr,"Fossilize INFO: Enumerated GPU #%u:\n",uVar28 & 0xffffffff);
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   name: %s\n",pcVar21);
                fflush(_stderr);
                uVar12 = pVVar2->apiVersion;
                fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(uVar12 >> 0x16),
                        (ulong)(uVar12 >> 0xc & 0x3ff),(ulong)(uVar12 & 0xfff));
                fflush(_stderr);
              }
              uVar28 = (ulong)opts->device_index;
              if ((long)uVar28 < 0) {
LAB_00179198:
                pVVar22 = *gpus.
                           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                this->gpu = pVVar22;
                (*vkGetPhysicalDeviceProperties)(pVVar22,pVVar2);
                fwrite("Fossilize INFO: Chose GPU:\n",0x1b,1,_stderr);
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   name: %s\n",pcVar21);
                fflush(_stderr);
                uVar12 = (this->gpu_props).apiVersion;
                fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(uVar12 >> 0x16),
                        (ulong)(uVar12 >> 0xc & 0x3ff),(ulong)(uVar12 & 0xfff));
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   vendorID: 0x%x\n",
                        (ulong)(this->gpu_props).vendorID);
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   deviceID: 0x%x\n",
                        (ulong)(this->gpu_props).deviceID);
                fflush(_stderr);
                uVar12 = (this->gpu_props).apiVersion & 0xfffff000;
                if (uVar12 <= uVar20) {
                  uVar20 = uVar12;
                }
                if (opts->application_info == (VkApplicationInfo *)0x0) {
                  uVar23 = uVar20;
                }
                if (uVar12 < uVar23) {
                  fwrite("Fossilize ERROR: Selected GPU does not support desired Vulkan API version.\n"
                         ,0x4b,1,_stderr);
                  goto LAB_0017907f;
                }
                this->api_version = uVar23;
                active_device_extensions.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                device_ext_count = 0;
                active_device_extensions.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                active_device_extensions.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                bVar7 = false;
                VVar9 = (*vkEnumerateDeviceExtensionProperties)
                                  (this->gpu,(char *)0x0,&device_ext_count,
                                   (VkExtensionProperties *)0x0);
                if (VVar9 == VK_SUCCESS) {
                  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                            (&device_ext_props,(ulong)device_ext_count,(allocator_type *)&gpu_props2
                            );
                  pVVar24 = device_ext_props.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (device_ext_count == 0) {
LAB_0017930e:
                    for (; pVVar24 !=
                           device_ext_props.
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_finish; pVVar24 = pVVar24 + 1) {
                      bVar7 = opts->want_amd_shader_info;
                      uVar20 = this->api_version;
                      lVar18 = 0;
                      do {
                        lVar29 = lVar18;
                        if (lVar29 == 0x68) break;
                        iVar11 = strcmp(*(char **)((long)&
                                                  filter_extension(char_const*,bool,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,unsigned_int)
                                                  ::vulkan_11_only_extensions + lVar29),
                                        pVVar24->extensionName);
                        lVar18 = lVar29 + 8;
                      } while (iVar11 != 0);
                      iVar11 = strcmp(pVVar24->extensionName,"VK_AMD_negative_viewport_height");
                      if ((iVar11 != 0) &&
                         (iVar11 = strcmp(pVVar24->extensionName,"VK_NV_ray_tracing"), iVar11 != 0))
                      {
                        iVar11 = strcmp(pVVar24->extensionName,"VK_EXT_buffer_device_address");
                        if (iVar11 == 0) {
                          bVar8 = find_extension(&device_ext_props,"VK_KHR_buffer_device_address");
                          if ((0x400fff < uVar20 || lVar29 == 0x68) && (!bVar8)) goto LAB_001793ca;
                        }
                        else if (0x400fff < uVar20 || lVar29 == 0x68) {
LAB_001793ca:
                          iVar11 = strcmp(pVVar24->extensionName,"VK_AMD_shader_info");
                          if ((iVar11 != 0) || (bVar7 != false)) {
                            gpu_props2._0_8_ = pVVar24;
                            std::vector<char_const*,std::allocator<char_const*>>::
                            emplace_back<char_const*>
                                      ((vector<char_const*,std::allocator<char_const*>> *)
                                       &active_device_extensions,(char **)&gpu_props2);
                          }
                        }
                      }
                    }
                    bVar7 = find_extension(&exts,"VK_KHR_get_physical_device_properties2");
                    memset(&gpu_features2,0,0xf0);
                    gpu_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
                    gpu_features2.pNext = &local_658;
                    local_648 = 0;
                    local_658 = 0x3b9ee4c8;
                    pvStack_650 = (void *)0x0;
                    if (bVar7) {
                      pvStack_650 = build_pnext_chain(&this->features,this->api_version,
                                                      active_device_extensions.
                                                                                                            
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (uint32_t)
                                                  ((ulong)((long)active_device_extensions.
                                                                                                                                  
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)active_device_extensions.
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                      (*vkGetPhysicalDeviceFeatures2KHR)(this->gpu,&gpu_features2);
                      this->pipeline_stats = (int)local_648 != 0;
                      if (((int)local_648 == 0) || (opts->want_pipeline_stats == false)) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = 1;
                      }
                      local_648 = CONCAT44(local_648._4_4_,uVar13);
                      __s = &gpu_props2;
                      memset(__s,0,0x348);
                      gpu_props2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                      gpu_props2.pNext =
                           build_pnext_chain(&this->props,this->api_version,
                                             active_device_extensions.
                                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                             (uint32_t)
                                             ((ulong)((long)active_device_extensions.
                                                                                                                        
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)active_device_extensions.
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                      pp_Var14 = &vkGetPhysicalDeviceProperties2KHR;
                      pVVar22 = this->gpu;
                    }
                    else {
                      (*vkGetPhysicalDeviceFeatures)(this->gpu,&gpu_features2.features);
                      memset(&gpu_props2,0,0x348);
                      gpu_props2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                      pVVar22 = this->gpu;
                      __s = (VkPhysicalDeviceProperties2 *)&gpu_props2.properties;
                      pp_Var14 = (PFN_vkGetPhysicalDeviceProperties2KHR *)
                                 &vkGetPhysicalDeviceProperties;
                    }
                    (**pp_Var14)(pVVar22,__s);
                    __src = opts->features;
                    if (__src == (VkPhysicalDeviceFeatures2 *)0x0) {
                      target_features = (VkPhysicalDeviceFeatures2 *)0x0;
                    }
                    else {
                      pVVar4 = opts->application_info;
                      target_features = __src;
                      if ((pVVar4 != (VkApplicationInfo *)0x0) &&
                         (pcVar21 = pVVar4->pEngineName, pcVar21 != (char *)0x0)) {
                        lVar18 = 0;
                        do {
                          if (lVar18 == 0x10) goto LAB_0017969a;
                          iVar11 = strcmp(*(char **)((long)&
                                                  application_info_promote_robustness2(VkApplicationInfo_const*)
                                                  ::promote_engine_names + lVar18),pcVar21);
                          lVar18 = lVar18 + 8;
                          pVVar15 = __src;
                        } while (iVar11 != 0);
                        do {
                          pVVar15 = (VkPhysicalDeviceFeatures2 *)pVVar15->pNext;
                          if (pVVar15 == (VkPhysicalDeviceFeatures2 *)0x0) {
                            VStack_5ac = 0;
                            uStack_5a8 = 0;
                            uStack_5bc = 0;
                            local_5b8 = 0;
                            uStack_5b4 = 0;
                            local_5b0 = 0;
                            local_5c0 = 0x3b9f2730;
                            if (&replacement_pdf2 != __src) {
                              memcpy(&replacement_pdf2,__src,0xf0);
                              pcVar21 = pVVar4->pEngineName;
                              target_features = &replacement_pdf2;
                            }
                            local_5b8 = SUB84(replacement_pdf2.pNext,0);
                            uStack_5b4 = (undefined4)((ulong)replacement_pdf2.pNext >> 0x20);
                            local_5b0 = (__src->features).robustBufferAccess;
                            uStack_5a8 = CONCAT44(uStack_5a8._4_4_,1);
                            VStack_5ac = local_5b0;
                            replacement_pdf2.pNext = &local_5c0;
                            break;
                          }
                        } while (pVVar15->sType !=
                                 VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT);
LAB_0017969a:
                        if ((pcVar21 != (char *)0x0) &&
                           (iVar11 = strcmp("vkd3d",pcVar21), iVar11 == 0)) {
                          do {
                            __src = (VkPhysicalDeviceFeatures2 *)__src->pNext;
                            if (__src == (VkPhysicalDeviceFeatures2 *)0x0) {
                              uStack_5cc = 0;
                              uStack_5c8 = 0;
                              local_5dc = 0;
                              uStack_5d8 = 0;
                              uStack_5d4 = 0;
                              uStack_5d0 = 0;
                              local_5e0 = 0x3b9e3cd3;
                              if (&replacement_pdf2 != target_features) {
                                memcpy(&replacement_pdf2,target_features,0xf0);
                                target_features = &replacement_pdf2;
                              }
                              uStack_5d8 = SUB84(replacement_pdf2.pNext,0);
                              uStack_5d4 = (undefined4)((ulong)replacement_pdf2.pNext >> 0x20);
                              uStack_5d0 = 1;
                              uStack_5cc = 1;
                              uStack_5c8 = CONCAT44(uStack_5c8._4_4_,1);
                              replacement_pdf2.pNext = &local_5e0;
                              break;
                            }
                          } while (__src->sType !=
                                   VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR
                                  );
                        }
                      }
                    }
                    active_extension_count =
                         (long)active_device_extensions.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)active_device_extensions.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3;
                    filter_feature_enablement
                              (&gpu_features2,&this->features,target_features,
                               active_device_extensions.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,&active_extension_count);
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                              (&active_device_extensions,active_extension_count);
                    pcVar21 = (char *)&family_count;
                    family_count = 0;
                    lVar18 = 0;
                    (*vkGetPhysicalDeviceQueueFamilyProperties)
                              (this->gpu,(uint32_t *)pcVar21,(VkQueueFamilyProperties *)0x0);
                    std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                    vector(&queue_props,(ulong)family_count,(allocator_type *)&device_layers);
                    (*vkGetPhysicalDeviceQueueFamilyProperties)
                              (this->gpu,(uint32_t *)pcVar21,
                               queue_props.
                               super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    while ((pVVar3 = (pointer)((long)&(queue_props.
                                                                                                              
                                                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  queueFlags + lVar18),
                           pVVar3 != queue_props.
                                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                     ._M_impl.super__Vector_impl_data._M_finish &&
                           ((*(int *)((long)&(queue_props.
                                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->queueCount
                                     + lVar18) == 0 || ((pVVar3->queueFlags & 1) == 0))))) {
                      lVar18 = lVar18 + 0x18;
                    }
                    active_device_layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    active_device_layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    active_device_layers.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    if (opts->enable_validation == true) {
                      device_layer_count = 0;
                      VVar9 = (*vkEnumerateDeviceLayerProperties)
                                        (this->gpu,&device_layer_count,(VkLayerProperties *)0x0);
                      if (VVar9 == VK_SUCCESS) {
                        layer = (uint32_t *)(ulong)device_layer_count;
                        std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                                  (&device_layers,(size_type)layer,
                                   (allocator_type *)&validation_extensions);
                        if (device_layer_count == 0) {
LAB_001798ad:
                          bVar8 = find_layer(&device_layers,(char *)layer);
                          if (bVar8) {
                            validation_extensions.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_1ec80f;
                            std::vector<char_const*,std::allocator<char_const*>>::
                            emplace_back<char_const*>
                                      ((vector<char_const*,std::allocator<char_const*>> *)
                                       &active_device_layers,(char **)&validation_extensions);
                            validation_ext_count = 0;
                            (*vkEnumerateDeviceExtensionProperties)
                                      (this->gpu,"VK_LAYER_KHRONOS_validation",&validation_ext_count
                                       ,(VkExtensionProperties *)0x0);
                            std::
                            vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                            vector(&validation_extensions,(ulong)validation_ext_count,
                                   (allocator_type *)&local_6f8);
                            (*vkEnumerateDeviceExtensionProperties)
                                      (this->gpu,"VK_LAYER_KHRONOS_validation",&validation_ext_count
                                       ,validation_extensions.
                                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                            pcVar21 = "VK_EXT_validation_cache";
                            bVar8 = find_extension(&validation_extensions,"VK_EXT_validation_cache")
                            ;
                            this->validation_cache = bVar8;
                            if (bVar8) {
                              pcVar21 = (char *)&local_6f8;
                              local_6f8 = "VK_EXT_validation_cache";
                              std::vector<char_const*,std::allocator<char_const*>>::
                              emplace_back<char_const*>
                                        ((vector<char_const*,std::allocator<char_const*>> *)
                                         &active_device_extensions,(char **)pcVar21);
                            }
                            std::
                            _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ::~_Vector_base(&validation_extensions.
                                             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                           );
                            std::_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                            ::~_Vector_base(&device_layers.
                                             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                           );
                            goto LAB_00179980;
                          }
                          fwrite("Fossilize ERROR: Cannot find VK_LAYER_KHRONOS_validation layer.\n"
                                 ,0x40,1,_stderr);
                          fflush(_stderr);
                        }
                        else {
                          layer = &device_layer_count;
                          VVar9 = (*vkEnumerateDeviceLayerProperties)
                                            (this->gpu,layer,
                                             device_layers.
                                             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                          if (VVar9 == VK_SUCCESS) goto LAB_001798ad;
                        }
                        std::_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>::
                        ~_Vector_base(&device_layers.
                                       super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                     );
                      }
LAB_00179d03:
                      bVar7 = false;
                    }
                    else {
LAB_00179980:
                      ppcVar5 = active_device_extensions.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                      uVar27 = (long)active_device_extensions.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)active_device_extensions.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      local_7c0 = (pointer)active_device_extensions.
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                      lVar29 = (long)uVar27 >> 5;
                      uVar28 = uVar27;
                      this_00 = (_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                 *)active_device_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                      for (lVar18 = lVar29; 0 < lVar18; lVar18 = lVar18 + -1) {
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00,(
                                                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                                  )pcVar21);
                        p_Var25 = this_00;
                        if (bVar8) goto LAB_00179a41;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00 + 8,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        p_Var25 = this_00 + 8;
                        if (bVar8) goto LAB_00179a41;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00 + 0x10,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        p_Var25 = this_00 + 0x10;
                        if (bVar8) goto LAB_00179a41;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00 + 0x18,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        p_Var25 = this_00 + 0x18;
                        if (bVar8) goto LAB_00179a41;
                        this_00 = this_00 + 0x20;
                        uVar28 = uVar28 - 0x20;
                      }
                      lVar18 = (long)uVar28 >> 3;
                      if (lVar18 == 1) {
LAB_00179a2f:
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00,(
                                                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                                  )pcVar21);
                        p_Var25 = this_00;
                        if (!bVar8) {
                          p_Var25 = (_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                     *)ppcVar5;
                        }
                      }
                      else if (lVar18 == 2) {
LAB_00179a1f:
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                ::operator()(this_00,(
                                                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                                  )pcVar21);
                        p_Var25 = this_00;
                        if (!bVar8) {
                          this_00 = this_00 + 8;
                          goto LAB_00179a2f;
                        }
                      }
                      else {
                        p_Var25 = (_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                   *)ppcVar5;
                        if ((lVar18 == 3) &&
                           (bVar8 = __gnu_cxx::__ops::
                                    _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_1>
                                    ::operator()(this_00,(
                                                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                                  )pcVar21), p_Var25 = this_00, !bVar8)) {
                          this_00 = this_00 + 8;
                          goto LAB_00179a1f;
                        }
                      }
LAB_00179a41:
                      this->supports_pipeline_feedback =
                           p_Var25 !=
                           (_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                            *)ppcVar5;
                      uVar28 = uVar27;
                      pVVar16 = local_7c0;
                      for (; 0 < lVar29; lVar29 = lVar29 + -1) {
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)pVVar16,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = pVVar16;
                        if (bVar8) goto LAB_00179af7;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)((long)pVVar16->layerName + 8),
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = (pointer)((long)pVVar16->layerName + 8);
                        if (bVar8) goto LAB_00179af7;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)((long)pVVar16->layerName + 0x10),
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = (pointer)((long)pVVar16->layerName + 0x10);
                        if (bVar8) goto LAB_00179af7;
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)((long)pVVar16->layerName + 0x18),
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = (pointer)((long)pVVar16->layerName + 0x18);
                        if (bVar8) goto LAB_00179af7;
                        pVVar16 = (pointer)((long)pVVar16->layerName + 0x20);
                        uVar28 = uVar28 - 0x20;
                      }
                      lVar18 = (long)uVar28 >> 3;
                      if (lVar18 == 1) {
LAB_00179ae5:
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)pVVar16,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = pVVar16;
                        if (!bVar8) {
                          pVVar19 = (pointer)ppcVar5;
                        }
                      }
                      else if (lVar18 == 2) {
LAB_00179ad5:
                        bVar8 = __gnu_cxx::__ops::
                                _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                              *)pVVar16,
                                             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                              )pcVar21);
                        pVVar19 = pVVar16;
                        if (!bVar8) {
                          pVVar16 = (pointer)((long)pVVar16->layerName + 8);
                          goto LAB_00179ae5;
                        }
                      }
                      else {
                        pVVar19 = (pointer)ppcVar5;
                        if ((lVar18 == 3) &&
                           (bVar8 = __gnu_cxx::__ops::
                                    _Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::$_2>
                                    ::operator()((_Iter_pred<Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                                  *)pVVar16,
                                                 (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                                  )pcVar21), pVVar19 = pVVar16, !bVar8)) {
                          pVVar16 = (pointer)((long)pVVar16->layerName + 8);
                          goto LAB_00179ad5;
                        }
                      }
LAB_00179af7:
                      this->amd_shader_info = pVVar19 != (pointer)ppcVar5;
                      this->supports_module_identifiers =
                           (this->features).shader_module_identifier.shaderModuleIdentifier == 1;
                      pVVar16 = (pointer)0x0;
                      device_layers.
                      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)&gpu_features2;
                      if (!bVar7) {
                        device_layers.
                        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                        _M_impl.super__Vector_impl_data._M_finish = pVVar16;
                      }
                      device_layers.
                      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
                      device_layers.
                      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
                      uVar28 = (long)active_device_layers.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)active_device_layers.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      pVVar19 = (pointer)active_device_layers.
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                      if (uVar28 == 0) {
                        pVVar19 = pVVar16;
                      }
                      pVVar17 = local_7c0;
                      if (local_7c0 == (pointer)ppcVar5) {
                        pVVar17 = pVVar16;
                      }
                      if (pVVar19 != (pointer)0x0) {
                        for (uVar26 = 0; uVar26 < (uVar28 >> 3 & 0xffffffff); uVar26 = uVar26 + 1) {
                          fprintf(_stderr,"Fossilize INFO: Enabling device layer: %s\n",
                                  *(undefined8 *)((long)pVVar19->layerName + uVar26 * 2 * 4));
                          fflush(_stderr);
                        }
                      }
                      if (pVVar17 != (pointer)0x0) {
                        for (uVar28 = 0; uVar28 < (uVar27 >> 3 & 0xffffffff); uVar28 = uVar28 + 1) {
                          fprintf(_stderr,"Fossilize INFO: Enabling device extension: %s\n",
                                  *(undefined8 *)((long)pVVar17->layerName + uVar28 * 2 * 4));
                          fflush(_stderr);
                        }
                      }
                      VVar9 = (*vkCreateDevice)(this->gpu,(VkDeviceCreateInfo *)&device_layers,
                                                (VkAllocationCallbacks *)0x0,&this->device);
                      if (VVar9 != VK_SUCCESS) {
                        pcVar21 = "Fossilize ERROR: Failed to create device.\n";
                        sStack_7f0 = 0x2a;
LAB_00179cf2:
                        fwrite(pcVar21,sStack_7f0,1,_stderr);
                        fflush(_stderr);
                        goto LAB_00179d03;
                      }
                      iVar11 = FeatureFilter::init(&this->feature_filter,
                                                   (EVP_PKEY_CTX *)(ulong)this->api_version);
                      if ((char)iVar11 == '\0') {
                        pcVar21 = "Fossilize ERROR: Failed to init feature filter.\n";
                        sStack_7f0 = 0x30;
                        goto LAB_00179cf2;
                      }
                      FeatureFilter::set_device_query_interface
                                (&this->feature_filter,&this->super_DeviceQueryInterface);
                      bVar7 = true;
                    }
                    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                              (&active_device_layers.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
                    std::
                    _Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ::~_Vector_base(&queue_props.
                                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                   );
                  }
                  else {
                    bVar7 = false;
                    VVar9 = (*vkEnumerateDeviceExtensionProperties)
                                      (this->gpu,(char *)0x0,&device_ext_count,
                                       device_ext_props.
                                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    pVVar24 = device_ext_props.
                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (VVar9 == VK_SUCCESS) goto LAB_0017930e;
                  }
                  std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                  ~_Vector_base(&device_ext_props.
                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                               );
                }
                std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                          (&active_device_extensions.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
              }
              else {
                if (uVar28 < (ulong)((long)gpus.
                                           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)gpus.
                                           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                  gpus.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       gpus.
                       super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar28;
                  goto LAB_00179198;
                }
                bVar7 = false;
                fprintf(_stderr,
                        "Fossilize ERROR: Device index %d is out of range, only %u devices on system.\n"
                       );
                fflush(_stderr);
              }
            }
            std::_Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
            ~_Vector_base(&gpus.
                           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                         );
          }
        }
        else {
          fwrite("Fossilize ERROR: Failed to create instance.\n",0x2c,1,_stderr);
          fflush(_stderr);
          bVar7 = false;
        }
LAB_00178f51:
        std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                  (&active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      }
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_00178f6b:
      std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
      ~_Vector_base(&exts.
                     super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                   );
      return bVar7;
    }
    pcVar21 = "Fossilize ERROR: Could not find loader.\n";
  }
  else {
    pcVar21 = "Fossilize ERROR: volkInitialize failed.\n";
  }
  sStack_7f0 = 0x28;
LAB_00178fb2:
  fwrite(pcVar21,sStack_7f0,1,_stderr);
  fflush(_stderr);
  return false;
}

Assistant:

bool VulkanDevice::init_device(const Options &opts)
{
	if (opts.null_device)
	{
		init_null_device();
		return true;
	}

	if (volkInitialize() != VK_SUCCESS)
	{
		LOGE("volkInitialize failed.\n");
		return false;
	}

	uint32_t instance_api_version = major_minor_version(volkGetInstanceVersion());
	if (instance_api_version == 0)
	{
		LOGE("Could not find loader.\n");
		return false;
	}

	uint32_t target_api_version = opts.application_info ? opts.application_info->apiVersion : instance_api_version;
	target_api_version = major_minor_version(target_api_version);

	if (target_api_version > instance_api_version)
	{
		LOGE("Database is targeting an API version which is unsupported by this Vulkan loader.\n");
		return false;
	}

	// Enable all extensions (FIXME: this is likely a problem).
	uint32_t ext_count = 0;
	if (vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> exts(ext_count);
	if (ext_count && vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, exts.data()) != VK_SUCCESS)
		return false;

	vector<const char *> active_layers;
	if (opts.enable_validation)
	{
		uint32_t layer_count = 0;
		if (vkEnumerateInstanceLayerProperties(&layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> layers(layer_count);
		if (vkEnumerateInstanceLayerProperties(&layer_count, layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(layers, "VK_LAYER_KHRONOS_validation"))
			active_layers.push_back("VK_LAYER_KHRONOS_validation");
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	bool use_debug_callback = find_extension(exts, VK_EXT_DEBUG_REPORT_EXTENSION_NAME);

	VkInstanceCreateInfo instance_info = { VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO };
	VkApplicationInfo app = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	app.apiVersion = instance_api_version;
	app.pApplicationName = "Fossilize Replayer";
	app.pEngineName = "Fossilize";

	instance_info.enabledLayerCount = uint32_t(active_layers.size());
	instance_info.ppEnabledLayerNames = active_layers.empty() ? nullptr : active_layers.data();
	instance_info.pApplicationInfo = opts.application_info ? opts.application_info : &app;

	for (uint32_t i = 0; i < instance_info.enabledLayerCount; i++)
		LOGI("Enabling instance layer: %s\n", instance_info.ppEnabledLayerNames[i]);
	for (uint32_t i = 0; i < instance_info.enabledExtensionCount; i++)
		LOGI("Enabling instance extension: %s\n", instance_info.ppEnabledExtensionNames[i]);

	vector<const char *> active_exts;
	for (auto &ext : exts)
		if (filter_instance_extension(ext.extensionName, instance_info.pApplicationInfo->apiVersion))
			active_exts.push_back(ext.extensionName);

	instance_info.enabledExtensionCount = uint32_t(active_exts.size());
	instance_info.ppEnabledExtensionNames = active_exts.empty() ? nullptr : active_exts.data();

	if (vkCreateInstance(&instance_info, nullptr, &instance) != VK_SUCCESS)
	{
		LOGE("Failed to create instance.\n");
		return false;
	}

	volkLoadInstance(instance);

	if (use_debug_callback)
	{
		VkDebugReportCallbackCreateInfoEXT cb_info = { VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT };
		cb_info.pfnCallback = debug_callback;
		cb_info.flags = VK_DEBUG_REPORT_ERROR_BIT_EXT;
		cb_info.pUserData = this;

		if (vkCreateDebugReportCallbackEXT(instance, &cb_info, nullptr, &callback) != VK_SUCCESS)
			return false;
	}

	uint32_t gpu_count = 0;
	if (vkEnumeratePhysicalDevices(instance, &gpu_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkPhysicalDevice> gpus(gpu_count);

	if (!gpu_count)
	{
		LOGE("No physical devices.\n");
		return false;
	}

	if (vkEnumeratePhysicalDevices(instance, &gpu_count, gpus.data()) != VK_SUCCESS)
		return false;

	for (uint32_t i = 0; i < gpu_count; i++)
	{
		vkGetPhysicalDeviceProperties(gpus[i], &gpu_props);
		LOGI("Enumerated GPU #%u:\n", i);
		LOGI("  name: %s\n", gpu_props.deviceName);
		LOGI("  apiVersion: %u.%u.%u\n",
		     VK_VERSION_MAJOR(gpu_props.apiVersion),
		     VK_VERSION_MINOR(gpu_props.apiVersion),
		     VK_VERSION_PATCH(gpu_props.apiVersion));
	}

	if (opts.device_index >= 0)
	{
		if (size_t(opts.device_index) >= gpus.size())
		{
			LOGE("Device index %d is out of range, only %u devices on system.\n",
			     opts.device_index, unsigned(gpus.size()));
			return false;
		}
		gpu = gpus[opts.device_index];
	}
	else
		gpu = gpus.front();

	vkGetPhysicalDeviceProperties(gpu, &gpu_props);
	LOGI("Chose GPU:\n");
	LOGI("  name: %s\n", gpu_props.deviceName);
	LOGI("  apiVersion: %u.%u.%u\n",
	     VK_VERSION_MAJOR(gpu_props.apiVersion),
	     VK_VERSION_MINOR(gpu_props.apiVersion),
	     VK_VERSION_PATCH(gpu_props.apiVersion));
	LOGI("  vendorID: 0x%x\n", gpu_props.vendorID);
	LOGI("  deviceID: 0x%x\n", gpu_props.deviceID);

	uint32_t gpu_api_version = major_minor_version(gpu_props.apiVersion);
	if (!opts.application_info)
		target_api_version = instance_api_version < gpu_api_version ? instance_api_version : gpu_api_version;

	if (target_api_version > gpu_api_version)
	{
		LOGE("Selected GPU does not support desired Vulkan API version.\n");
		return false;
	}

	api_version = target_api_version;

	vector<const char *> active_device_extensions;
	uint32_t device_ext_count = 0;
	if (vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> device_ext_props(device_ext_count);
	if (device_ext_count && vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, device_ext_props.data()) != VK_SUCCESS)
		return false;

	for (auto &ext : device_ext_props)
		if (filter_extension(ext.extensionName, opts.want_amd_shader_info, device_ext_props, api_version))
			active_device_extensions.push_back(ext.extensionName);

	bool has_device_features2 = find_extension(exts, VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);

	VkPhysicalDeviceFeatures2 gpu_features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
	VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature = {
		VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_EXECUTABLE_PROPERTIES_FEATURES_KHR
	};
	gpu_features2.pNext = &stats_feature;
	if (has_device_features2)
	{
		stats_feature.pNext = build_pnext_chain(features, api_version,
		                                        active_device_extensions.data(),
		                                        uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceFeatures2KHR(gpu, &gpu_features2);

		pipeline_stats = stats_feature.pipelineExecutableInfo;
		if (pipeline_stats && opts.want_pipeline_stats)
			stats_feature.pipelineExecutableInfo = VK_TRUE;
		else
			stats_feature.pipelineExecutableInfo = VK_FALSE;
	}
	else
		vkGetPhysicalDeviceFeatures(gpu, &gpu_features2.features);

	VkPhysicalDeviceProperties2 gpu_props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	if (has_device_features2)
	{
		gpu_props2.pNext = build_pnext_chain(props, api_version,
		                                     active_device_extensions.data(),
		                                     uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceProperties2KHR(gpu, &gpu_props2);
	}
	else
		vkGetPhysicalDeviceProperties(gpu, &gpu_props2.properties);

	// A fairly ugly, but important workaround.
	// When replaying dxvk/vkd3d, we expect robustness2, but this was not captured on earlier databases,
	// which means we get different shader hashes when replaying.
	// For now, it's pragmatic to just enable robustness2 until old Fossils have been retired.
	// New fossils will capture robustness2.
	const auto *requested_pdf2 = opts.features;
	VkPhysicalDeviceFeatures2 replacement_pdf2;
	VkPhysicalDeviceRobustness2FeaturesEXT replacement_robustness2;
	VkPhysicalDeviceFragmentShadingRateFeaturesKHR replacement_fragment_shading_rate;

	const auto begin_replacement = [&](void *pnext) {
		if (&replacement_pdf2 != requested_pdf2)
		{
			replacement_pdf2 = *requested_pdf2;
			requested_pdf2 = &replacement_pdf2;
		}

		static_cast<VkBaseOutStructure *>(pnext)->pNext =
				static_cast<VkBaseOutStructure *>(replacement_pdf2.pNext);
		replacement_pdf2.pNext = pnext;
	};

	if (opts.features)
	{
		if (application_info_promote_robustness2(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
				    opts.features->pNext) == nullptr)
		{
			replacement_robustness2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
			begin_replacement(&replacement_robustness2);

			replacement_robustness2.robustBufferAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.robustImageAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.nullDescriptor = VK_TRUE;
		}

		if (application_info_promote_fragment_shading_rate(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
				    opts.features->pNext) == nullptr)
		{
			replacement_fragment_shading_rate = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
			begin_replacement(&replacement_fragment_shading_rate);
			reset_features(replacement_fragment_shading_rate, VK_TRUE);
		}
	}

	size_t active_extension_count = active_device_extensions.size();
	filter_feature_enablement(gpu_features2, features, requested_pdf2,
	                          active_device_extensions.data(), &active_extension_count);
	active_device_extensions.resize(active_extension_count);

	// Just pick one graphics queue.
	// FIXME: Does shader compilation depend on which queues we have enabled?
	// FIXME: Potentially separate code-gen if COMPUTE queue needs different optimizations, etc ...
	uint32_t family_count = 0;
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, nullptr);
	vector<VkQueueFamilyProperties> queue_props(family_count);
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, queue_props.data());

	VkDeviceQueueCreateInfo queue_info = { VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO };
	static float one = 1.0f;
	queue_info.pQueuePriorities = &one;
	queue_info.queueCount = 1;
	for (auto &queue_prop : queue_props)
	{
		if ((queue_prop.queueCount > 0) && (queue_prop.queueFlags & VK_QUEUE_GRAPHICS_BIT))
		{
			queue_info.queueFamilyIndex = uint32_t(&queue_prop - queue_props.data());
			break;
		}
	}

	vector<const char *> active_device_layers;
	if (opts.enable_validation)
	{
		uint32_t device_layer_count = 0;
		if (vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> device_layers(device_layer_count);
		if (device_layer_count && vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, device_layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(device_layers, "VK_LAYER_KHRONOS_validation"))
		{
			active_device_layers.push_back("VK_LAYER_KHRONOS_validation");

			uint32_t validation_ext_count = 0;
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, nullptr);
			vector<VkExtensionProperties> validation_extensions(validation_ext_count);
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, validation_extensions.data());
			validation_cache = find_extension(validation_extensions, VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
			if (validation_cache)
				active_device_extensions.push_back(VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
		}
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	supports_pipeline_feedback = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_EXT_PIPELINE_CREATION_FEEDBACK_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	amd_shader_info = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	supports_module_identifiers = features.shader_module_identifier.shaderModuleIdentifier == VK_TRUE;

	VkDeviceCreateInfo device_info = { VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO };
	device_info.pNext = has_device_features2 ? &gpu_features2 : nullptr;
	device_info.pEnabledFeatures = has_device_features2 ? nullptr : &gpu_features2.features;
	device_info.pQueueCreateInfos = &queue_info;
	device_info.queueCreateInfoCount = 1;
	device_info.enabledLayerCount = uint32_t(active_device_layers.size());
	device_info.ppEnabledLayerNames = active_device_layers.empty() ? nullptr : active_device_layers.data();
	device_info.enabledExtensionCount = uint32_t(active_device_extensions.size());
	device_info.ppEnabledExtensionNames = active_device_extensions.empty() ? nullptr : active_device_extensions.data();

	if (device_info.ppEnabledLayerNames)
		for (uint32_t i = 0; i < device_info.enabledLayerCount; i++)
			LOGI("Enabling device layer: %s\n", device_info.ppEnabledLayerNames[i]);

	if (device_info.ppEnabledExtensionNames)
		for (uint32_t i = 0; i < device_info.enabledExtensionCount; i++)
			LOGI("Enabling device extension: %s\n", device_info.ppEnabledExtensionNames[i]);

	if (vkCreateDevice(gpu, &device_info, nullptr, &device) != VK_SUCCESS)
	{
		LOGE("Failed to create device.\n");
		return false;
	}

	if (!feature_filter.init(api_version, active_device_extensions.data(), active_device_extensions.size(),
	                         &gpu_features2, &gpu_props2))
	{
		LOGE("Failed to init feature filter.\n");
		return false;
	}

	feature_filter.set_device_query_interface(this);

	return true;
}